

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O0

void xercesc_4_0::XMLInitializer::initializeXSDErrorReporter(void)

{
  gErrMsgLoader = XMLPlatformUtils::loadMsgSet((XMLCh *)XMLUni::fgXMLErrDomain);
  if (gErrMsgLoader == (XMLMsgLoader *)0x0) {
    XMLPlatformUtils::panic(Panic_CantLoadMsgDomain);
  }
  gValidMsgLoader = XMLPlatformUtils::loadMsgSet((XMLCh *)XMLUni::fgValidityDomain);
  if (gValidMsgLoader == (XMLMsgLoader *)0x0) {
    XMLPlatformUtils::panic(Panic_CantLoadMsgDomain);
  }
  return;
}

Assistant:

void XMLInitializer::initializeXSDErrorReporter()
{
    gErrMsgLoader = XMLPlatformUtils::loadMsgSet(XMLUni::fgXMLErrDomain);

    if (!gErrMsgLoader)
      XMLPlatformUtils::panic(PanicHandler::Panic_CantLoadMsgDomain);

    gValidMsgLoader = XMLPlatformUtils::loadMsgSet(XMLUni::fgValidityDomain);

    if (!gValidMsgLoader)
      XMLPlatformUtils::panic(PanicHandler::Panic_CantLoadMsgDomain);
}